

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int big2_scanLit(int open,ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  
  if (ptr == end) {
    return -1;
  }
  do {
    bVar2 = *ptr;
    if (0xdb < bVar2) {
      if (bVar2 == 0xff) {
        if (0xfd < ((byte *)ptr)[1]) {
switchD_004e1d71_caseD_0:
          *nextTokPtr = ptr;
          return 0;
        }
      }
      else if (bVar2 - 0xdc < 4) goto switchD_004e1d71_caseD_0;
      goto switchD_004e1d71_caseD_2;
    }
    if (bVar2 - 0xd8 < 4) {
switchD_004e1d71_caseD_7:
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
      pbVar1 = (byte *)ptr + 4;
      goto LAB_004e1db3;
    }
    if (bVar2 != 0) goto switchD_004e1d71_caseD_2;
    bVar2 = *(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[1]);
    switch(bVar2) {
    case 0:
    case 1:
    case 8:
      goto switchD_004e1d71_caseD_0;
    case 5:
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
    default:
switchD_004e1d71_caseD_2:
      pbVar1 = (byte *)ptr + 2;
      break;
    case 6:
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
      pbVar1 = (byte *)ptr + 3;
      break;
    case 7:
      goto switchD_004e1d71_caseD_7;
    case 0xc:
    case 0xd:
      pbVar1 = (byte *)ptr + 2;
      if ((uint)bVar2 == open) {
        if (pbVar1 == (byte *)end) {
          return -0x1b;
        }
        *nextTokPtr = (char *)pbVar1;
        if (*pbVar1 != 0) {
          return 0;
        }
        uVar3 = (uint)*(byte *)((long)enc[1].scanners + (ulong)((byte *)ptr)[3]);
        if (0x1e < uVar3) {
          return 0;
        }
        if ((0x40300e00U >> (uVar3 & 0x1f) & 1) != 0) {
          return 0x1b;
        }
        return 0;
      }
    }
LAB_004e1db3:
    ptr = (char *)pbVar1;
    if (ptr == end) {
      return -1;
    }
  } while( true );
}

Assistant:

static
int PREFIX(scanLit)(int open, const ENCODING *enc,
                    const char *ptr, const char *end,
                    const char **nextTokPtr)
{
  while (ptr != end) {
    int t = BYTE_TYPE(enc, ptr);
    switch (t) {
    INVALID_CASES(ptr, nextTokPtr)
    case BT_QUOT:
    case BT_APOS:
      ptr += MINBPC(enc);
      if (t != open)
        break;
      if (ptr == end)
        return -XML_TOK_LITERAL;
      *nextTokPtr = ptr;
      switch (BYTE_TYPE(enc, ptr)) {
      case BT_S: case BT_CR: case BT_LF:
      case BT_GT: case BT_PERCNT: case BT_LSQB:
        return XML_TOK_LITERAL;
      default:
        return XML_TOK_INVALID;
      }
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  return XML_TOK_PARTIAL;
}